

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O0

void Amap_ManMergeNodeCutsMux(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  Vec_Int_t *p_00;
  Amap_Lib_t *p_01;
  uint fComplFanin;
  uint fComplFanin_00;
  uint fComplFanin_01;
  int iVar1;
  Amap_Cut_t AVar2;
  Amap_Obj_t *pFanin;
  Amap_Obj_t *pFanin_00;
  Amap_Obj_t *pFanin_01;
  Amap_Cut_t *pCut0_00;
  Amap_Cut_t *pCut1_00;
  Amap_Cut_t *pCut2_00;
  Amap_Nod_t *pAVar3;
  Amap_Nod_t *pNod;
  int c2;
  int c1;
  int c0;
  int x;
  Amap_Cut_t *pCut2;
  Amap_Cut_t *pCut1;
  Amap_Cut_t *pCut0;
  int fComplFanin2;
  int fComplFanin1;
  int fComplFanin0;
  Amap_Obj_t *pFanin2;
  Amap_Obj_t *pFanin1;
  Amap_Obj_t *pFanin0;
  Vec_Int_t *vRules;
  Amap_Obj_t *pNode_local;
  Amap_Man_t *p_local;
  
  p_00 = p->pLib->vRules3;
  pFanin = Amap_ObjFanin0(p,pNode);
  pFanin_00 = Amap_ObjFanin1(p,pNode);
  pFanin_01 = Amap_ObjFanin2(p,pNode);
  fComplFanin = Amap_ObjFaninC0(pNode);
  fComplFanin_00 = Amap_ObjFaninC1(pNode);
  fComplFanin_01 = Amap_ObjFaninC2(pNode);
  if ((pNode->field_11).pData != (void *)0x0) {
    __assert_fail("pNode->pData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMerge.c"
                  ,0x184,"void Amap_ManMergeNodeCutsMux(Amap_Man_t *, Amap_Obj_t *)");
  }
  if (((uint)*(undefined8 *)pNode & 7) == 6) {
    if ((*(ulong *)pNode >> 0x3e & 1) == 0) {
      for (c1 = 0; iVar1 = Vec_IntSize(p_00), c1 < iVar1; c1 = c1 + 4) {
        iVar1 = Vec_IntEntry(p_00,c1);
        iVar1 = Amap_ManFindCut(pNode,pFanin,fComplFanin,iVar1,p->vCuts0);
        if (iVar1 == 0) {
          iVar1 = Vec_IntEntry(p_00,c1 + 1);
          iVar1 = Amap_ManFindCut(pNode,pFanin_00,fComplFanin_00,iVar1,p->vCuts1);
          if (iVar1 == 0) {
            iVar1 = Vec_IntEntry(p_00,c1 + 2);
            iVar1 = Amap_ManFindCut(pNode,pFanin_01,fComplFanin_01,iVar1,p->vCuts2);
            if (iVar1 == 0) {
              for (c2 = 0; iVar1 = Vec_PtrSize(p->vCuts0), c2 < iVar1; c2 = c2 + 1) {
                pCut0_00 = (Amap_Cut_t *)Vec_PtrEntry(p->vCuts0,c2);
                for (pNod._4_4_ = 0; iVar1 = Vec_PtrSize(p->vCuts1), pNod._4_4_ < iVar1;
                    pNod._4_4_ = pNod._4_4_ + 1) {
                  pCut1_00 = (Amap_Cut_t *)Vec_PtrEntry(p->vCuts1,pNod._4_4_);
                  for (pNod._0_4_ = 0; iVar1 = Vec_PtrSize(p->vCuts2), (int)pNod < iVar1;
                      pNod._0_4_ = (int)pNod + 1) {
                    pCut2_00 = (Amap_Cut_t *)Vec_PtrEntry(p->vCuts2,(int)pNod);
                    p_01 = p->pLib;
                    iVar1 = Vec_IntEntry(p_00,c1 + 3);
                    pAVar3 = Amap_LibNod(p_01,iVar1);
                    if (pAVar3->pSets != (Amap_Set_t *)0x0) {
                      if (((uint)*pCut0_00 >> 0x11 == 1) &&
                         (((uint)*pCut0_00 >> 0x10 & 1) != fComplFanin)) {
                        AVar2 = (Amap_Cut_t)Abc_LitNot((int)pCut0_00[1]);
                        pCut0_00[1] = AVar2;
                      }
                      if (((uint)*pCut1_00 >> 0x11 == 1) &&
                         (((uint)*pCut1_00 >> 0x10 & 1) != fComplFanin_00)) {
                        AVar2 = (Amap_Cut_t)Abc_LitNot((int)pCut1_00[1]);
                        pCut1_00[1] = AVar2;
                      }
                      if (((uint)*pCut2_00 >> 0x11 == 1) &&
                         (((uint)*pCut2_00 >> 0x10 & 1) != fComplFanin_01)) {
                        AVar2 = (Amap_Cut_t)Abc_LitNot((int)pCut2_00[1]);
                        pCut2_00[1] = AVar2;
                      }
                      iVar1 = Vec_IntEntry(p_00,c1 + 3);
                      Amap_ManCutCreate3(p,pCut0_00,pCut1_00,pCut2_00,iVar1);
                      if (((uint)*pCut0_00 >> 0x11 == 1) &&
                         (((uint)*pCut0_00 >> 0x10 & 1) != fComplFanin)) {
                        AVar2 = (Amap_Cut_t)Abc_LitNot((int)pCut0_00[1]);
                        pCut0_00[1] = AVar2;
                      }
                      if (((uint)*pCut1_00 >> 0x11 == 1) &&
                         (((uint)*pCut1_00 >> 0x10 & 1) != fComplFanin_00)) {
                        AVar2 = (Amap_Cut_t)Abc_LitNot((int)pCut1_00[1]);
                        pCut1_00[1] = AVar2;
                      }
                      if (((uint)*pCut2_00 >> 0x11 == 1) &&
                         (((uint)*pCut2_00 >> 0x10 & 1) != fComplFanin_01)) {
                        AVar2 = (Amap_Cut_t)Abc_LitNot((int)pCut2_00[1]);
                        pCut2_00[1] = AVar2;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      Amap_ManCutSaveStored(p,pNode);
      p->nCutsUsed = (*(uint *)&pNode->field_0x8 >> 0xc) + p->nCutsUsed;
      p->nCutsTried3 =
           (*(uint *)&pFanin->field_0x8 >> 0xc) * (*(uint *)&pFanin_00->field_0x8 >> 0xc) *
           (*(uint *)&pFanin_01->field_0x8 >> 0xc) + p->nCutsTried3;
      return;
    }
    __assert_fail("pNode->fRepr == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMerge.c"
                  ,0x186,"void Amap_ManMergeNodeCutsMux(Amap_Man_t *, Amap_Obj_t *)");
  }
  __assert_fail("pNode->Type == AMAP_OBJ_MUX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMerge.c"
                ,0x185,"void Amap_ManMergeNodeCutsMux(Amap_Man_t *, Amap_Obj_t *)");
}

Assistant:

void Amap_ManMergeNodeCutsMux( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    Vec_Int_t * vRules = p->pLib->vRules3;
    Amap_Obj_t * pFanin0 = Amap_ObjFanin0( p, pNode );
    Amap_Obj_t * pFanin1 = Amap_ObjFanin1( p, pNode );
    Amap_Obj_t * pFanin2 = Amap_ObjFanin2( p, pNode );
    int fComplFanin0 = Amap_ObjFaninC0( pNode );
    int fComplFanin1 = Amap_ObjFaninC1( pNode );
    int fComplFanin2 = Amap_ObjFaninC2( pNode );
    Amap_Cut_t * pCut0, * pCut1, * pCut2;
    int x, c0, c1, c2;
    assert( pNode->pData == NULL );
    assert( pNode->Type == AMAP_OBJ_MUX );
    assert( pNode->fRepr == 0 );
    // go through the rules
    for ( x = 0; x < Vec_IntSize(vRules); x += 4 )
    {
        if ( Amap_ManFindCut( pNode, pFanin0, fComplFanin0, Vec_IntEntry(vRules, x), p->vCuts0 ) )
            continue;
        if ( Amap_ManFindCut( pNode, pFanin1, fComplFanin1, Vec_IntEntry(vRules, x+1), p->vCuts1 ) )
            continue;
        if ( Amap_ManFindCut( pNode, pFanin2, fComplFanin2, Vec_IntEntry(vRules, x+2), p->vCuts2 ) )
            continue;
        Vec_PtrForEachEntry( Amap_Cut_t *, p->vCuts0, pCut0, c0 )
        Vec_PtrForEachEntry( Amap_Cut_t *, p->vCuts1, pCut1, c1 )
        Vec_PtrForEachEntry( Amap_Cut_t *, p->vCuts2, pCut2, c2 )
        {
            Amap_Nod_t * pNod = Amap_LibNod( p->pLib, Vec_IntEntry(vRules, x+3) );
            if ( pNod->pSets == NULL )
                continue;
            // complement literals
            if ( pCut0->nFans == 1 && (pCut0->fInv ^ fComplFanin0) )
                pCut0->Fans[0] = Abc_LitNot(pCut0->Fans[0]);
            if ( pCut1->nFans == 1 && (pCut1->fInv ^ fComplFanin1) )
                pCut1->Fans[0] = Abc_LitNot(pCut1->Fans[0]);
            if ( pCut2->nFans == 1 && (pCut2->fInv ^ fComplFanin2) )
                pCut2->Fans[0] = Abc_LitNot(pCut2->Fans[0]);
            // create new cut
            Amap_ManCutCreate3( p, pCut0, pCut1, pCut2, Vec_IntEntry(vRules, x+3) );
            // uncomplement literals
            if ( pCut0->nFans == 1 && (pCut0->fInv ^ fComplFanin0) )
                pCut0->Fans[0] = Abc_LitNot(pCut0->Fans[0]);
            if ( pCut1->nFans == 1 && (pCut1->fInv ^ fComplFanin1) )
                pCut1->Fans[0] = Abc_LitNot(pCut1->Fans[0]);
            if ( pCut2->nFans == 1 && (pCut2->fInv ^ fComplFanin2) )
                pCut2->Fans[0] = Abc_LitNot(pCut2->Fans[0]);
        }
    }
    Amap_ManCutSaveStored( p, pNode );
    p->nCutsUsed += pNode->nCuts;
    p->nCutsTried3 += pFanin0->nCuts * pFanin1->nCuts * pFanin2->nCuts;

//    Amap_ManPrintCuts( pNode );
}